

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData * __thiscall cfd::core::Psbt::GetData(ByteData *__return_storage_ptr__,Psbt *this)

{
  wally_psbt *psbt;
  uint32_t uVar1;
  uchar *puVar2;
  size_type sVar3;
  CfdException *this_00;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  int local_58 [2];
  int ret;
  allocator<unsigned_char> local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  size_t size;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((psbt == (wally_psbt *)0x0) || (psbt->num_inputs != 0)) {
    uVar1 = GetDataSize(this);
    ::std::allocator<unsigned_char>::allocator(&local_41);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (local_40,(ulong)uVar1,&local_41);
    ::std::allocator<unsigned_char>::~allocator(&local_41);
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_40);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_40);
    local_58[0] = wally_psbt_to_bytes(psbt,0,puVar2,sVar3,
                                      &bytes.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_58[0] != 0) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x7e4;
      local_70.funcname = "GetData";
      logger::warn<int&>(&local_70,"wally_psbt_to_bytes NG[{}]",local_58);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"psbt to bytes error.",&local_91);
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_90);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_40);
    ByteData::ByteData(__return_storage_ptr__,puVar2,
                       (uint32_t)
                       bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_40);
  }
  else {
    CreatePsbtOutputOnlyData(__return_storage_ptr__,psbt);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::GetData() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t size = 0;

  if ((psbt_pointer != nullptr) && (psbt_pointer->num_inputs == 0)) {
    return CreatePsbtOutputOnlyData(psbt_pointer);
  }

  std::vector<uint8_t> bytes(GetDataSize());
  int ret =
      wally_psbt_to_bytes(psbt_pointer, 0, bytes.data(), bytes.size(), &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_to_bytes NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt to bytes error.");
  }
  return ByteData(bytes.data(), static_cast<uint32_t>(size));
}